

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TikzPlotter.cpp
# Opt level: O0

void __thiscall vectorgraphics::TikzPlotter::cleanup(TikzPlotter *this,EVP_PKEY_CTX *ctx)

{
  byte bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  path local_160;
  path local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  path local_f0;
  path local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  path local_70;
  path local_48;
  byte local_19;
  EVP_PKEY_CTX *pEStack_18;
  bool success;
  string *name_local;
  path *path_local;
  
  local_19 = 1;
  pEStack_18 = ctx;
  name_local = (string *)this;
  std::operator+(&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ctx,
                 ".aux");
  std::filesystem::__cxx11::path::path(&local_70,&local_90,auto_format);
  std::filesystem::__cxx11::operator/(&local_48,(path *)this,&local_70);
  bVar1 = std::filesystem::remove(&local_48);
  local_19 = bVar1 & local_19 & 1;
  std::filesystem::__cxx11::path::~path(&local_48);
  std::filesystem::__cxx11::path::~path(&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::operator+(&local_110,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ctx
                 ,".log");
  std::filesystem::__cxx11::path::path(&local_f0,&local_110,auto_format);
  std::filesystem::__cxx11::operator/(&local_c8,(path *)this,&local_f0);
  bVar1 = std::filesystem::remove(&local_c8);
  local_19 = bVar1 & local_19 & 1;
  std::filesystem::__cxx11::path::~path(&local_c8);
  std::filesystem::__cxx11::path::~path(&local_f0);
  std::__cxx11::string::~string((string *)&local_110);
  std::operator+(&local_180,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ctx
                 ,".sta");
  std::filesystem::__cxx11::path::path(&local_160,&local_180,auto_format);
  std::filesystem::__cxx11::operator/(&local_138,(path *)this,&local_160);
  bVar1 = std::filesystem::remove(&local_138);
  local_19 = (local_19 & 1 & bVar1 & 1) != 0;
  std::filesystem::__cxx11::path::~path(&local_138);
  std::filesystem::__cxx11::path::~path(&local_160);
  std::__cxx11::string::~string((string *)&local_180);
  return;
}

Assistant:

bool TikzPlotter::cleanup(std::filesystem::path path, std::string name) {
    bool success = true;
    success &= std::filesystem::remove(path / (name + ".aux"));
    success &= std::filesystem::remove(path / (name + ".log"));
    success &= std::filesystem::remove(path / (name + ".sta"));
    return success;
  }